

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::make_tran_string(lest *this,string *txt)

{
  bool bVar1;
  reference pcVar2;
  string local_1f8 [32];
  lest local_1d8 [32];
  undefined8 local_1b8 [3];
  undefined8 local_1a0;
  undefined8 local_198;
  const_iterator pos;
  ostringstream os;
  string *txt_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pos);
  local_1a0 = std::__cxx11::string::begin();
  local_198 = local_1a0;
  while( true ) {
    local_1b8[0] = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_198,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1b8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_198);
    transformed_abi_cxx11_(local_1d8,*pcVar2);
    std::operator<<((ostream *)&pos,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pos);
  return this;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}